

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_params.h
# Opt level: O0

int aom_check_grain_params_equiv(aom_film_grain_t *pa,aom_film_grain_t *pb)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  int *in_RDI;
  int num_pos;
  int local_4;
  
  if (*in_RDI == *in_RSI) {
    if (in_RDI[0x1e] == in_RSI[0x1e]) {
      iVar1 = memcmp(in_RDI + 2,in_RSI + 2,(long)(in_RDI[0x1e] << 1) << 3);
      if (iVar1 == 0) {
        if (in_RDI[0x33] == in_RSI[0x33]) {
          iVar1 = memcmp(in_RDI + 0x1f,in_RSI + 0x1f,(long)(in_RDI[0x33] << 1) << 3);
          if (iVar1 == 0) {
            if (in_RDI[0x48] == in_RSI[0x48]) {
              iVar1 = memcmp(in_RDI + 0x34,in_RSI + 0x34,(long)(in_RDI[0x48] << 1) << 3);
              if (iVar1 == 0) {
                if (in_RDI[0x49] == in_RSI[0x49]) {
                  if (in_RDI[0x4a] == in_RSI[0x4a]) {
                    iVar1 = in_RDI[0x4a] * 2 * (in_RDI[0x4a] + 1);
                    iVar2 = memcmp(in_RDI + 0x4b,in_RSI + 0x4b,(long)iVar1 << 2);
                    if (iVar2 == 0) {
                      iVar2 = memcmp(in_RDI + 99,in_RSI + 99,(long)iVar1 << 2);
                      if (iVar2 == 0) {
                        iVar1 = memcmp(in_RDI + 0x7c,in_RSI + 0x7c,(long)iVar1 << 2);
                        if (iVar1 == 0) {
                          if (in_RDI[0x95] == in_RSI[0x95]) {
                            if (in_RDI[0x96] == in_RSI[0x96]) {
                              if (in_RDI[0x97] == in_RSI[0x97]) {
                                if (in_RDI[0x98] == in_RSI[0x98]) {
                                  if (in_RDI[0x99] == in_RSI[0x99]) {
                                    if (in_RDI[0x9a] == in_RSI[0x9a]) {
                                      if (in_RDI[0x9b] == in_RSI[0x9b]) {
                                        if (in_RDI[0x9c] == in_RSI[0x9c]) {
                                          if (in_RDI[0x9d] == in_RSI[0x9d]) {
                                            if (in_RDI[0x9e] == in_RSI[0x9e]) {
                                              if (in_RDI[0x9f] == in_RSI[0x9f]) {
                                                if (in_RDI[0xa0] == in_RSI[0xa0]) {
                                                  local_4 = 1;
                                                }
                                                else {
                                                  local_4 = 0;
                                                }
                                              }
                                              else {
                                                local_4 = 0;
                                              }
                                            }
                                            else {
                                              local_4 = 0;
                                            }
                                          }
                                          else {
                                            local_4 = 0;
                                          }
                                        }
                                        else {
                                          local_4 = 0;
                                        }
                                      }
                                      else {
                                        local_4 = 0;
                                      }
                                    }
                                    else {
                                      local_4 = 0;
                                    }
                                  }
                                  else {
                                    local_4 = 0;
                                  }
                                }
                                else {
                                  local_4 = 0;
                                }
                              }
                              else {
                                local_4 = 0;
                              }
                            }
                            else {
                              local_4 = 0;
                            }
                          }
                          else {
                            local_4 = 0;
                          }
                        }
                        else {
                          local_4 = 0;
                        }
                      }
                      else {
                        local_4 = 0;
                      }
                    }
                    else {
                      local_4 = 0;
                    }
                  }
                  else {
                    local_4 = 0;
                  }
                }
                else {
                  local_4 = 0;
                }
              }
              else {
                local_4 = 0;
              }
            }
            else {
              local_4 = 0;
            }
          }
          else {
            local_4 = 0;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int aom_check_grain_params_equiv(
    const aom_film_grain_t *const pa, const aom_film_grain_t *const pb) {
  if (pa->apply_grain != pb->apply_grain) return 0;
  // Don't compare update_parameters

  if (pa->num_y_points != pb->num_y_points) return 0;
  if (memcmp(pa->scaling_points_y, pb->scaling_points_y,
             pa->num_y_points * 2 * sizeof(*pa->scaling_points_y)) != 0)
    return 0;

  if (pa->num_cb_points != pb->num_cb_points) return 0;
  if (memcmp(pa->scaling_points_cb, pb->scaling_points_cb,
             pa->num_cb_points * 2 * sizeof(*pa->scaling_points_cb)) != 0)
    return 0;

  if (pa->num_cr_points != pb->num_cr_points) return 0;
  if (memcmp(pa->scaling_points_cr, pb->scaling_points_cr,
             pa->num_cr_points * 2 * sizeof(*pa->scaling_points_cr)) != 0)
    return 0;

  if (pa->scaling_shift != pb->scaling_shift) return 0;
  if (pa->ar_coeff_lag != pb->ar_coeff_lag) return 0;

  const int num_pos = 2 * pa->ar_coeff_lag * (pa->ar_coeff_lag + 1);
  if (memcmp(pa->ar_coeffs_y, pb->ar_coeffs_y,
             num_pos * sizeof(*pa->ar_coeffs_y)) != 0)
    return 0;
  if (memcmp(pa->ar_coeffs_cb, pb->ar_coeffs_cb,
             num_pos * sizeof(*pa->ar_coeffs_cb)) != 0)
    return 0;
  if (memcmp(pa->ar_coeffs_cr, pb->ar_coeffs_cr,
             num_pos * sizeof(*pa->ar_coeffs_cr)) != 0)
    return 0;

  if (pa->ar_coeff_shift != pb->ar_coeff_shift) return 0;

  if (pa->cb_mult != pb->cb_mult) return 0;
  if (pa->cb_luma_mult != pb->cb_luma_mult) return 0;
  if (pa->cb_offset != pb->cb_offset) return 0;

  if (pa->cr_mult != pb->cr_mult) return 0;
  if (pa->cr_luma_mult != pb->cr_luma_mult) return 0;
  if (pa->cr_offset != pb->cr_offset) return 0;

  if (pa->overlap_flag != pb->overlap_flag) return 0;
  if (pa->clip_to_restricted_range != pb->clip_to_restricted_range) return 0;
  if (pa->bit_depth != pb->bit_depth) return 0;
  if (pa->chroma_scaling_from_luma != pb->chroma_scaling_from_luma) return 0;
  if (pa->grain_scale_shift != pb->grain_scale_shift) return 0;

  return 1;
}